

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O1

QString * __thiscall
QString::arg_impl(QString *__return_storage_ptr__,QString *this,QAnyStringView a,int fieldWidth,
                 QChar fillChar)

{
  Data *pDVar1;
  QStringView s;
  QStringView s_00;
  QStringView arg;
  QStringView larg;
  uint uVar2;
  char16_t *pcVar3;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar4;
  char16_t *pcVar5;
  char16_t *pcVar6;
  long in_FS_OFFSET;
  QByteArrayView in;
  anon_struct_536_1_ba1d6aae convert;
  undefined1 *local_278;
  undefined1 *puStack_270;
  undefined1 *local_268;
  undefined1 *puStack_260;
  undefined1 local_250 [512];
  QVLABase<char16_t> local_50;
  long local_38;
  
  in.m_size = a.field_0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_268 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_260 = &DAT_aaaaaaaaaaaaaaaa;
  local_278 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_270 = &DAT_aaaaaaaaaaaaaaaa;
  s.m_data = (this->d).ptr;
  s.m_size = (this->d).size;
  findArgEscapes((ArgEscapeData *)&local_278,s);
  if (puStack_270 == (undefined1 *)0x0) {
    pDVar1 = (this->d).d;
    (__return_storage_ptr__->d).d = pDVar1;
    (__return_storage_ptr__->d).ptr = (this->d).ptr;
    (__return_storage_ptr__->d).size = (this->d).size;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  else {
    memset(local_250,0xaa,0x218);
    local_50.super_QVLABaseBase.a = 0x100;
    local_50.super_QVLABaseBase.s = 0;
    uVar2 = (uint)a.m_size & 3;
    pcVar6 = (char16_t *)(a.m_size >> 2);
    aVar4 = in.m_size;
    local_50.super_QVLABaseBase.ptr = local_250;
    if (uVar2 != 2) {
      if (uVar2 == 1) {
        pcVar5 = (char16_t *)0x100;
        if ((char16_t *)0x100 < pcVar6) {
          pcVar5 = pcVar6;
        }
        QVLABase<char16_t>::reallocate_impl
                  (&local_50,0x100,local_250,(qsizetype)pcVar6,(qsizetype)pcVar5);
        local_50.super_QVLABaseBase.s = (qsizetype)pcVar6;
        qt_from_latin1((char16_t *)local_50.super_QVLABaseBase.ptr,in.m_size,(size_t)pcVar6);
        aVar4.m_data = local_50.super_QVLABaseBase.ptr;
        pcVar6 = (char16_t *)local_50.super_QVLABaseBase.s;
      }
      else {
        pcVar5 = (char16_t *)0x100;
        if ((char16_t *)0x100 < pcVar6) {
          pcVar5 = pcVar6;
        }
        pcVar3 = pcVar6;
        QVLABase<char16_t>::reallocate_impl
                  (&local_50,0x100,local_250,(qsizetype)pcVar6,(qsizetype)pcVar5);
        aVar4.m_data = local_50.super_QVLABaseBase.ptr;
        in.m_data = (storage_type *)pcVar3;
        local_50.super_QVLABaseBase.s = (qsizetype)pcVar6;
        pcVar6 = QUtf8::convertToUnicode((QUtf8 *)local_50.super_QVLABaseBase.ptr,pcVar6,in);
        pcVar6 = (char16_t *)((long)pcVar6 - (long)aVar4.m_data >> 1);
      }
    }
    s_00.m_data = (this->d).ptr;
    s_00.m_size = (this->d).size;
    arg.m_size = (qsizetype)pcVar6;
    arg.m_data = (storage_type_conflict *)aVar4.m_data;
    larg.m_size = (qsizetype)pcVar6;
    larg.m_data = (storage_type_conflict *)aVar4.m_data;
    replaceArgEscapes(__return_storage_ptr__,s_00,(ArgEscapeData *)&local_278,(long)fieldWidth,arg,
                      larg,fillChar);
    if ((undefined1 *)local_50.super_QVLABaseBase.ptr != local_250) {
      QtPrivate::sizedFree(local_50.super_QVLABaseBase.ptr,local_50.super_QVLABaseBase.a * 2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString QString::arg_impl(QAnyStringView a, int fieldWidth, QChar fillChar) const
{
    ArgEscapeData d = findArgEscapes(*this);

    if (Q_UNLIKELY(d.occurrences == 0)) {
        qWarning("QString::arg: Argument missing: \"%ls\", \"%ls\"", qUtf16Printable(*this),
                  qUtf16Printable(a.toString()));
        return *this;
    }
    struct {
        QVarLengthArray<char16_t> out;
        QStringView operator()(QStringView in) noexcept { return in; }
        QStringView operator()(QLatin1StringView in)
        {
            out.resize(in.size());
            qt_from_latin1(out.data(), in.data(), size_t(in.size()));
            return out;
        }
        QStringView operator()(QUtf8StringView in)
        {
            out.resize(in.size());
            return QStringView{out.data(), QUtf8::convertToUnicode(out.data(), in)};
        }
    } convert;

    QStringView sv = a.visit(std::ref(convert));
    return replaceArgEscapes(*this, d, fieldWidth, sv, sv, fillChar);
}